

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  DeclaratorSyntax *node;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  ImplicitAnsiPortSyntax *pIVar1;
  BumpAllocator *in_stack_00000088;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000090;
  BumpAllocator *this;
  
  this = (BumpAllocator *)__child_stack;
  node = (DeclaratorSyntax *)
         deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000090,in_stack_00000088);
  not_null<slang::syntax::PortHeaderSyntax_*>::operator*
            ((not_null<slang::syntax::PortHeaderSyntax_*> *)0xa58acd);
  args = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
         deepClone<slang::syntax::PortHeaderSyntax>
                   ((PortHeaderSyntax *)node,(BumpAllocator *)__child_stack);
  not_null<slang::syntax::DeclaratorSyntax_*>::operator*
            ((not_null<slang::syntax::DeclaratorSyntax_*> *)0xa58aed);
  deepClone<slang::syntax::DeclaratorSyntax>(node,(BumpAllocator *)__child_stack);
  pIVar1 = BumpAllocator::
           emplace<slang::syntax::ImplicitAnsiPortSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::PortHeaderSyntax&,slang::syntax::DeclaratorSyntax&>
                     (this,args,(PortHeaderSyntax *)node,(DeclaratorSyntax *)__child_stack);
  return (int)pIVar1;
}

Assistant:

static SyntaxNode* clone(const ImplicitAnsiPortSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ImplicitAnsiPortSyntax>(
        *deepClone(node.attributes, alloc),
        *deepClone<PortHeaderSyntax>(*node.header, alloc),
        *deepClone<DeclaratorSyntax>(*node.declarator, alloc)
    );
}